

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O3

void __thiscall
write_shape_ini::operator()(write_shape_ini *this,shape_def *s,xr_ini_writer *w,uint32_t id)

{
  int iVar1;
  undefined4 in_register_0000000c;
  size_t sVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  char *buf;
  int __fd;
  char buffer [128];
  char acStack_98 [128];
  
  sVar2 = CONCAT44(in_register_0000000c,id);
  iVar1 = snprintf(acStack_98,0x80,"shape_type_%d");
  __fd = (int)acStack_98;
  if (0 < iVar1) {
    xray_re::xr_ini_writer::write(w,__fd,(void *)(ulong)s->type,sVar2);
  }
  if (s->type == '\x01') {
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_matrix_c_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf_01,sVar2);
    }
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_matrix_i_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf_02,sVar2);
    }
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_matrix_j_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf_03,sVar2);
    }
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_matrix_k_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf_04,sVar2);
    }
  }
  else if (s->type == '\0') {
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_center_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf,sVar2);
    }
    sVar2 = (size_t)id;
    iVar1 = snprintf(acStack_98,0x80,"shape_radius_%d");
    if (0 < iVar1) {
      xray_re::xr_ini_writer::write(w,__fd,__buf_00,sVar2);
    }
  }
  return;
}

Assistant:

void operator()(const shape_def& s, xr_ini_writer* w, uint32_t id) const {
	char buffer[128];
	char* buf = &buffer[0];
	int n = xr_snprintf(buf, sizeof(buffer), "shape_type_%d", id);

	if (n > 0)
		w->write(buf, s.type);

	if (s.type == SHAPE_SPHERE)
	{
		n = xr_snprintf(buf, sizeof(buffer), "shape_center_%d", id);
		if (n > 0)
			w->write(buf, s.sphere.p);

		n = xr_snprintf(buf, sizeof(buffer), "shape_radius_%d", id);
		if (n > 0)
			w->write(buf, s.sphere.r);
	}
	else if (s.type == SHAPE_BOX)
	{
		n = xr_snprintf(buf, sizeof(buffer), "shape_matrix_c_%d", id);
		if (n > 0)
			w->write(buf, s.box.c);

		n = xr_snprintf(buf, sizeof(buffer), "shape_matrix_i_%d", id);
		if (n > 0)
			w->write(buf, s.box.i);

		n = xr_snprintf(buf, sizeof(buffer), "shape_matrix_j_%d", id);
		if (n > 0)
			w->write(buf, s.box.j);

		n = xr_snprintf(buf, sizeof(buffer), "shape_matrix_k_%d", id);
		if (n > 0)
			w->write(buf, s.box.k);
	}
}